

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  ImVec2 IVar1;
  
  (this->ChildWindows).Size = 0;
  (this->ChildWindows).Capacity = 0;
  (this->ChildWindows).Data = (ImGuiWindow **)0x0;
  (this->CursorPos).x = 0.0;
  (this->CursorPos).y = 0.0;
  (this->CursorPosPrevLine).x = 0.0;
  (this->CursorPosPrevLine).y = 0.0;
  (this->CursorStartPos).x = 0.0;
  (this->CursorStartPos).y = 0.0;
  (this->CursorMaxPos).x = 0.0;
  (this->CursorMaxPos).y = 0.0;
  this->CurrentLineHeight = 0.0;
  this->CurrentLineTextBaseOffset = 0.0;
  this->PrevLineHeight = 0.0;
  this->PrevLineTextBaseOffset = 0.0;
  (this->ItemFlagsStack).Size = 0;
  (this->ItemFlagsStack).Capacity = 0;
  (this->ItemFlagsStack).Data = (int *)0x0;
  (this->ItemWidthStack).Size = 0;
  (this->ItemWidthStack).Capacity = 0;
  (this->ItemWidthStack).Data = (float *)0x0;
  (this->TextWrapPosStack).Size = 0;
  (this->TextWrapPosStack).Capacity = 0;
  (this->TextWrapPosStack).Data = (float *)0x0;
  (this->GroupStack).Size = 0;
  (this->GroupStack).Capacity = 0;
  (this->GroupStack).Data = (ImGuiGroupData *)0x0;
  this->LogLinePosY = -1.0;
  this->TreeDepth = 0;
  this->TreeDepthMayJumpToParentOnPop = 0;
  this->LastItemId = 0;
  this->LastItemStatusFlags = 0;
  (this->LastItemDisplayRect).Min.x = 3.4028235e+38;
  (this->LastItemDisplayRect).Min.y = 3.4028235e+38;
  (this->LastItemDisplayRect).Max.x = -3.4028235e+38;
  (this->LastItemDisplayRect).Max.y = -3.4028235e+38;
  IVar1 = (this->LastItemDisplayRect).Max;
  (this->LastItemRect).Min = (this->LastItemDisplayRect).Min;
  (this->LastItemRect).Max = IVar1;
  this->NavHideHighlightOneFrame = false;
  this->NavHasScroll = false;
  this->NavLayerCurrent = 0;
  this->NavLayerCurrentMask = 1;
  this->NavLayerActiveMask = 0;
  this->NavLayerActiveMaskNext = 0;
  this->MenuBarAppending = false;
  (this->MenuBarOffset).x = 0.0;
  (this->MenuBarOffset).y = 0.0;
  this->StateStorage = (ImGuiStorage *)0x0;
  this->LayoutType = 0;
  this->ParentLayoutType = 0;
  this->ItemFlags = 1;
  this->ItemWidth = 0.0;
  this->TextWrapPos = -1.0;
  this->ColumnsSet = (ImGuiColumnsSet *)0x0;
  this->StackSizesBackup[4] = 0;
  this->StackSizesBackup[5] = 0;
  this->IndentX = 0.0;
  this->GroupOffsetX = 0.0;
  this->StackSizesBackup[0] = 0;
  this->StackSizesBackup[1] = 0;
  this->StackSizesBackup[2] = 0;
  this->StackSizesBackup[3] = 0;
  this->ColumnsOffsetX = 0.0;
  return;
}

Assistant:

inline ImVector()           { Size = Capacity = 0; Data = NULL; }